

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicInputIBase::Run(BasicInputIBase *this)

{
  CallLogWrapper *this_00;
  UVec4 *v;
  bool bVar1;
  GLuint GVar2;
  long lVar3;
  ulong uVar4;
  undefined **ppuVar5;
  int *piVar6;
  char *format;
  UVec4 *v_00;
  UVec4 *v_01;
  byte bVar7;
  Vector<unsigned_int,_4> local_490;
  Vector<unsigned_int,_4> local_480;
  Vector<int,_4> local_470;
  Vector<int,_4> local_460;
  UVec4 *local_450;
  IVec4 *local_448;
  char *glsl_vs;
  IVec4 datai [32];
  UVec4 dataui [32];
  
  bVar7 = 0;
  glsl_vs = 
  "#version 430 core\nlayout(location = 0) in ivec4 vs_in_attribi[8];\nlayout(location = 8) in uvec4 vs_in_attribui[8];\nout StageData {\n  ivec4 attribi[8];\n  uvec4 attribui[8];\n} vs_out;\nvoid main() {\n  for (int i = 0; i < vs_in_attribi.length(); ++i) {\n    vs_out.attribi[i] = vs_in_attribi[i];\n  }\n  for (int i = 0; i < vs_in_attribui.length(); ++i) {\n    vs_out.attribui[i] = vs_in_attribui[i];\n  }\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar2 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->m_po = GVar2;
  GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&glsl_vs,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,GVar2);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
  lVar3 = 0x10;
  ppuVar5 = &PTR_anon_var_dwarf_3c9ea3_01dd75e0;
  piVar6 = datai[0].m_data;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined **)piVar6 = *ppuVar5;
    ppuVar5 = ppuVar5 + (ulong)bVar7 * -2 + 1;
    piVar6 = piVar6 + (ulong)bVar7 * 0xfffffffffffffffc + 2;
  }
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,this->m_po,0x10,(GLchar **)datai,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_po);
  bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_po);
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)datai,0x400,
               (allocator_type *)dataui);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_xfbo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8c8e,datai[0].m_data._8_8_ - datai[0].m_data._0_8_,
               (void *)datai[0].m_data._0_8_,0x88ea);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)datai);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_po);
    lVar3 = 0;
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
              (this_00,0,0,2,this->instance_count,this->base_instance);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    do {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)((long)datai[0].m_data + lVar3));
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x200);
    lVar3 = 0;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x80,datai);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x100,0x80,datai + 8);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x200,0x80,datai + 0x10);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x300,0x80,datai + 0x18);
    do {
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)((long)dataui[0].m_data + lVar3));
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x200);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x80,0x80,dataui);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x180,0x80,dataui + 8);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x280,0x80,dataui + 0x10);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x380,0x80,dataui + 0x18);
    local_448 = this->expected_datai;
    local_450 = this->expected_dataui;
    uVar4 = 0;
    for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 0x10) {
      v_00 = (UVec4 *)(local_448 + uVar4);
      tcu::Vector<int,_4>::Vector
                (&local_460,(Vector<int,_4> *)((long)this->expected_datai[0].m_data + lVar3));
      v_01 = (UVec4 *)(datai + uVar4);
      v = (UVec4 *)((long)datai[0].m_data + lVar3);
      tcu::Vector<int,_4>::Vector(&local_470,(Vector<int,_4> *)v);
      if ((((local_460.m_data[0] != local_470.m_data[0]) ||
           (local_460.m_data[1] != local_470.m_data[1])) ||
          (local_460.m_data[2] != local_470.m_data[2])) ||
         (v_01 = v, local_460.m_data[3] != local_470.m_data[3])) {
        format = "Datai is: %d %d %d %d, datai should be: %d %d %d %d, index is: %d.\n";
        goto LAB_00a87541;
      }
      v_00 = (UVec4 *)((long)this->expected_dataui[0].m_data + lVar3);
      tcu::Vector<unsigned_int,_4>::Vector(&local_480,v_00);
      v_01 = (UVec4 *)((long)dataui[0].m_data + lVar3);
      tcu::Vector<unsigned_int,_4>::Vector(&local_490,v_01);
      if (local_480.m_data[0] != local_490.m_data[0]) {
LAB_00a8752d:
        format = "Dataui is: %u %u %u %u, dataui should be: %u %u %u %u, index is: %d.\n";
LAB_00a87541:
        anon_unknown_0::Output
                  (format,(ulong)v_01->m_data[0],(ulong)v_01->m_data[1],(ulong)v_01->m_data[2],
                   (ulong)v_01->m_data[3],(ulong)v_00->m_data[0],(ulong)v_00->m_data[1],
                   (ulong)v_00->m_data[2],(ulong)v_00->m_data[3],uVar4);
        return -(ulong)(uVar4 < 0x20);
      }
      v_00 = local_450 + uVar4;
      v_01 = dataui + uVar4;
      if (local_480.m_data[1] != local_490.m_data[1]) goto LAB_00a8752d;
      if ((local_480.m_data[2] != local_490.m_data[2]) ||
         (local_480.m_data[3] != local_490.m_data[3])) {
        format = "Dataui is: %u %u %u %u, dataui should be: %u %u %u %u, index is: %d.\n";
        goto LAB_00a87541;
      }
      uVar4 = uVar4 + 1;
    }
    lVar3 = 0;
  }
  else {
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "layout(location = 0) in ivec4 vs_in_attribi[8];" NL
			"layout(location = 8) in uvec4 vs_in_attribui[8];" NL "out StageData {" NL "  ivec4 attribi[8];" NL
			"  uvec4 attribui[8];" NL "} vs_out;" NL "void main() {" NL
			"  for (int i = 0; i < vs_in_attribi.length(); ++i) {" NL "    vs_out.attribi[i] = vs_in_attribi[i];" NL
			"  }" NL "  for (int i = 0; i < vs_in_attribui.length(); ++i) {" NL
			"    vs_out.attribui[i] = vs_in_attribui[i];" NL "  }" NL "}";
		m_po = glCreateProgram();
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glCompileShader(sh);
			glAttachShader(m_po, sh);
			glDeleteShader(sh);
		}
		{
			const GLchar* const v[16] = { "StageData.attribi[0]",  "StageData.attribi[1]",  "StageData.attribi[2]",
										  "StageData.attribi[3]",  "StageData.attribi[4]",  "StageData.attribi[5]",
										  "StageData.attribi[6]",  "StageData.attribi[7]",  "StageData.attribui[0]",
										  "StageData.attribui[1]", "StageData.attribui[2]", "StageData.attribui[3]",
										  "StageData.attribui[4]", "StageData.attribui[5]", "StageData.attribui[6]",
										  "StageData.attribui[7]" };
			glTransformFeedbackVaryings(m_po, 16, v, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_po);
		if (!CheckProgram(m_po))
			return ERROR;

		{
			std::vector<GLubyte> zero(64 * 16);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbo);
			glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (GLsizeiptr)zero.size(), &zero[0], GL_DYNAMIC_COPY);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);
		glBeginTransformFeedback(GL_POINTS);
		glDrawArraysInstancedBaseInstance(GL_POINTS, 0, 2, instance_count, base_instance);
		glEndTransformFeedback();

		IVec4 datai[32];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0 * 16 * 8, 16 * 8, &datai[0]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 2 * 16 * 8, 16 * 8, &datai[8]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 4 * 16 * 8, 16 * 8, &datai[16]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 6 * 16 * 8, 16 * 8, &datai[24]);
		UVec4 dataui[32];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 1 * 16 * 8, 16 * 8, &dataui[0]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * 16 * 8, 16 * 8, &dataui[8]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 5 * 16 * 8, 16 * 8, &dataui[16]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 7 * 16 * 8, 16 * 8, &dataui[24]);

		for (int i = 0; i < 32; ++i)
		{
			if (!IsEqual(expected_datai[i], datai[i]))
			{
				Output("Datai is: %d %d %d %d, datai should be: %d %d %d %d, index is: %d.\n", datai[i][0], datai[i][1],
					   datai[i][2], datai[i][3], expected_datai[i][0], expected_datai[i][1], expected_datai[i][2],
					   expected_datai[i][3], i);
				return ERROR;
			}
			if (!IsEqual(expected_dataui[i], dataui[i]))
			{
				Output("Dataui is: %u %u %u %u, dataui should be: %u %u %u %u, index is: %d.\n", dataui[i][0],
					   dataui[i][1], dataui[i][2], dataui[i][3], expected_dataui[i][0], expected_dataui[i][1],
					   expected_dataui[i][2], expected_dataui[i][3], i);
				return ERROR;
			}
		}
		return NO_ERROR;
	}